

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * jsonnet::internal::jsonnet_unlex(Tokens *tokens)

{
  Kind KVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pbVar5;
  ostream *poVar6;
  undefined8 in_RSI;
  string *in_RDI;
  char *cp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  FodderElement *f;
  const_iterator __end3;
  const_iterator __begin3;
  Fodder *__range3;
  Token *t;
  const_iterator __end2;
  const_iterator __begin2;
  Tokens *__range2;
  stringstream ss;
  ostream *in_stack_fffffffffffffd28;
  ostream *in_stack_fffffffffffffd30;
  char *local_210;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f0;
  reference local_1d8;
  FodderElement *local_1d0;
  __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_1c8;
  Fodder *local_1c0;
  reference local_1b8;
  _Self local_1b0;
  _Self local_1a8;
  undefined8 local_1a0;
  stringstream local_198 [16];
  ostream local_188 [376];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = local_10;
  local_1a8._M_node =
       (_List_node_base *)
       std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
       begin((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
             in_stack_fffffffffffffd28);
  local_1b0._M_node =
       (_List_node_base *)
       std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::end
                 ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
                  in_stack_fffffffffffffd28);
  do {
    bVar2 = std::operator!=(&local_1a8,&local_1b0);
    if (!bVar2) {
LAB_0024fc4f:
      std::__cxx11::stringstream::str();
      std::__cxx11::stringstream::~stringstream(local_198);
      return in_RDI;
    }
    local_1b8 = std::_List_const_iterator<jsonnet::internal::Token>::operator*
                          ((_List_const_iterator<jsonnet::internal::Token> *)
                           in_stack_fffffffffffffd30);
    local_1c0 = &local_1b8->fodder;
    local_1c8._M_current =
         (FodderElement *)
         std::
         vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         ::begin((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffffd28);
    local_1d0 = (FodderElement *)
                std::
                vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                ::end((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffffd28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                               *)in_stack_fffffffffffffd30,
                              (__normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                               *)in_stack_fffffffffffffd28), bVar2) {
      local_1d8 = __gnu_cxx::
                  __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                  ::operator*(&local_1c8);
      KVar1 = local_1d8->kind;
      if (KVar1 == LINE_END) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_1d8->comment);
        if (sVar3 == 0) {
          poVar6 = std::operator<<(local_188,"LineEnd(");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1d8->blanks);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1d8->indent);
          std::operator<<(poVar6,")\n");
        }
        else {
          poVar6 = std::operator<<(local_188,"LineEnd(");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1d8->blanks);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1d8->indent);
          poVar6 = std::operator<<(poVar6,", ");
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_1d8->comment,0);
          poVar6 = std::operator<<(poVar6,(string *)pvVar4);
          std::operator<<(poVar6,")\n");
        }
      }
      else if (KVar1 == INTERSTITIAL) {
        poVar6 = std::operator<<(local_188,"Interstitial(");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_1d8->comment,0);
        poVar6 = std::operator<<(poVar6,(string *)pvVar4);
        std::operator<<(poVar6,")\n");
      }
      else if (KVar1 == PARAGRAPH) {
        std::operator<<(local_188,"Paragraph(\n");
        local_1f0 = &local_1d8->comment;
        local_1f8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffd28);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd28);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffffd30,
                                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffffd28), bVar2) {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_1f8);
          poVar6 = std::operator<<(local_188,"    ");
          poVar6 = std::operator<<(poVar6,(string *)pbVar5);
          std::operator<<(poVar6,'\n');
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_1f8);
        }
        poVar6 = std::operator<<(local_188,")");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1d8->blanks);
        std::operator<<(poVar6,"\n");
      }
      __gnu_cxx::
      __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
      ::operator++(&local_1c8);
    }
    if (local_1b8->kind == END_OF_FILE) {
      std::operator<<(local_188,"EOF\n");
      goto LAB_0024fc4f;
    }
    if (local_1b8->kind == STRING_DOUBLE) {
      poVar6 = std::operator<<(local_188,"\"");
      poVar6 = std::operator<<(poVar6,(string *)&local_1b8->data);
      std::operator<<(poVar6,"\"\n");
    }
    else if (local_1b8->kind == STRING_SINGLE) {
      poVar6 = std::operator<<(local_188,"\'");
      poVar6 = std::operator<<(poVar6,(string *)&local_1b8->data);
      std::operator<<(poVar6,"\'\n");
    }
    else if (local_1b8->kind == STRING_BLOCK) {
      std::operator<<(local_188,"|||\n");
      std::operator<<(local_188,(string *)&local_1b8->stringBlockIndent);
      for (local_210 = (char *)std::__cxx11::string::c_str(); *local_210 != '\0';
          local_210 = local_210 + 1) {
        std::operator<<(local_188,*local_210);
        if (((*local_210 == '\n') && (local_210[1] != '\n')) && (local_210[1] != '\0')) {
          std::operator<<(local_188,(string *)&local_1b8->stringBlockIndent);
        }
      }
      in_stack_fffffffffffffd30 =
           std::operator<<(local_188,(string *)&local_1b8->stringBlockTermIndent);
      std::operator<<(in_stack_fffffffffffffd30,"|||\n");
    }
    else {
      in_stack_fffffffffffffd28 = std::operator<<(local_188,(string *)&local_1b8->data);
      std::operator<<(in_stack_fffffffffffffd28,"\n");
    }
    std::_List_const_iterator<jsonnet::internal::Token>::operator++(&local_1a8);
  } while( true );
}

Assistant:

std::string jsonnet_unlex(const Tokens &tokens)
{
    std::stringstream ss;
    for (const auto &t : tokens) {
        for (const auto &f : t.fodder) {
            switch (f.kind) {
                case FodderElement::LINE_END: {
                    if (f.comment.size() > 0) {
                        ss << "LineEnd(" << f.blanks << ", " << f.indent << ", " << f.comment[0]
                           << ")\n";
                    } else {
                        ss << "LineEnd(" << f.blanks << ", " << f.indent << ")\n";
                    }
                } break;

                case FodderElement::INTERSTITIAL: {
                    ss << "Interstitial(" << f.comment[0] << ")\n";
                } break;

                case FodderElement::PARAGRAPH: {
                    ss << "Paragraph(\n";
                    for (const auto &line : f.comment) {
                        ss << "    " << line << '\n';
                    }
                    ss << ")" << f.blanks << "\n";
                } break;
            }
        }
        if (t.kind == Token::END_OF_FILE) {
            ss << "EOF\n";
            break;
        }
        if (t.kind == Token::STRING_DOUBLE) {
            ss << "\"" << t.data << "\"\n";
        } else if (t.kind == Token::STRING_SINGLE) {
            ss << "'" << t.data << "'\n";
        } else if (t.kind == Token::STRING_BLOCK) {
            ss << "|||\n";
            ss << t.stringBlockIndent;
            for (const char *cp = t.data.c_str(); *cp != '\0'; ++cp) {
                ss << *cp;
                if (*cp == '\n' && *(cp + 1) != '\n' && *(cp + 1) != '\0') {
                    ss << t.stringBlockIndent;
                }
            }
            ss << t.stringBlockTermIndent << "|||\n";
        } else {
            ss << t.data << "\n";
        }
    }
    return ss.str();
}